

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O0

string * __thiscall
upb::generator::GetFieldRep_abi_cxx11_
          (string *__return_storage_ptr__,generator *this,upb_MiniTableField *field32,
          upb_MiniTableField *field64)

{
  allocator<char> local_40;
  allocator<char> local_3f;
  allocator<char> local_3e;
  allocator<char> local_3d [20];
  allocator<char> local_29;
  upb_FieldRep local_28;
  upb_FieldRep local_24;
  upb_FieldRep rep64;
  upb_FieldRep rep32;
  upb_MiniTableField *field64_local;
  upb_MiniTableField *field32_local;
  
  _rep64 = field32;
  field64_local = (upb_MiniTableField *)this;
  field32_local = (upb_MiniTableField *)__return_storage_ptr__;
  local_24 = ::_upb_MiniTableField_GetRep_dont_copy_me__upb_internal_use_only
                       ((upb_MiniTableField *)this);
  local_28 = ::_upb_MiniTableField_GetRep_dont_copy_me__upb_internal_use_only(_rep64);
  switch(local_24) {
  case kUpb_FieldRep_1Byte:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"kUpb_FieldRep_1Byte",&local_29);
    std::allocator<char>::~allocator(&local_29);
    break;
  case kUpb_FieldRep_4Byte:
    if (local_28 == kUpb_FieldRep_4Byte) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"kUpb_FieldRep_4Byte",local_3d);
      std::allocator<char>::~allocator(local_3d);
    }
    else {
      if (local_28 != kUpb_FieldRep_8Byte) {
        __assert_fail("rep64 == kUpb_FieldRep_8Byte",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb_generator/common.cc"
                      ,100,
                      "std::string upb::generator::GetFieldRep(const upb_MiniTableField *, const upb_MiniTableField *)"
                     );
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,
                 "UPB_SIZE(kUpb_FieldRep_4Byte, kUpb_FieldRep_8Byte)",&local_3e);
      std::allocator<char>::~allocator(&local_3e);
    }
    break;
  case kUpb_FieldRep_StringView:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"kUpb_FieldRep_StringView",&local_3f);
    std::allocator<char>::~allocator(&local_3f);
    break;
  case kUpb_FieldRep_8Byte:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"kUpb_FieldRep_8Byte",&local_40);
    std::allocator<char>::~allocator(&local_40);
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb_generator/common.cc"
                  ,0x70,
                  "std::string upb::generator::GetFieldRep(const upb_MiniTableField *, const upb_MiniTableField *)"
                 );
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetFieldRep(const upb_MiniTableField* field32,
                        const upb_MiniTableField* field64) {
  const auto rep32 = UPB_PRIVATE(_upb_MiniTableField_GetRep)(field32);
  const auto rep64 = UPB_PRIVATE(_upb_MiniTableField_GetRep)(field64);

  switch (rep32) {
    case kUpb_FieldRep_1Byte:
      return "kUpb_FieldRep_1Byte";
      break;
    case kUpb_FieldRep_4Byte: {
      if (rep64 == kUpb_FieldRep_4Byte) {
        return "kUpb_FieldRep_4Byte";
      } else {
        assert(rep64 == kUpb_FieldRep_8Byte);
        return "UPB_SIZE(kUpb_FieldRep_4Byte, kUpb_FieldRep_8Byte)";
      }
      break;
    }
    case kUpb_FieldRep_StringView:
      return "kUpb_FieldRep_StringView";
      break;
    case kUpb_FieldRep_8Byte:
      return "kUpb_FieldRep_8Byte";
      break;
  }
  UPB_UNREACHABLE();
}